

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O3

void __thiscall directory::print(directory *this)

{
  uint uVar1;
  pointer piVar2;
  uint uVar3;
  ostream *poVar4;
  long *plVar5;
  pointer __nbytes;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  vector<int,_std::allocator<int>_> *__range2;
  uint *puVar6;
  ulong uVar7;
  index *index;
  pointer piVar8;
  vector<int,_std::allocator<int>_> visited;
  bucket bucket;
  fstream bucketFile;
  vector<int,_std::allocator<int>_> local_288;
  bucket local_270;
  string *local_248;
  uint local_240 [132];
  
  local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  uVar3 = this->bucket_size;
  if (uVar3 != 0) {
    local_248 = &this->typeName;
    uVar7 = 0;
    do {
      __nbytes = (this->bucket_ids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      uVar1 = __nbytes[uVar7];
      for (puVar6 = (uint *)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
          puVar6 != (uint *)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
        if (*puVar6 == uVar1) goto LAB_0010df76;
      }
      local_240[0] = uVar1;
      if (local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_288,
                   (iterator)
                   local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_240);
        __nbytes = (this->bucket_ids).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
      }
      else {
        *local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = uVar1;
        local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      generateBucketFileName((string *)&local_270,local_248,__nbytes[uVar7]);
      std::fstream::fstream(local_240,(string *)&local_270,_S_out|_S_in|_S_bin);
      __buf = extraout_RDX;
      if ((vector<index,_std::allocator<index>_> *)CONCAT44(local_270._4_4_,local_270.id) !=
          &local_270.indices) {
        operator_delete((undefined1 *)CONCAT44(local_270._4_4_,local_270.id),
                        (ulong)((long)&(local_270.indices.
                                        super__Vector_base<index,_std::allocator<index>_>._M_impl.
                                        super__Vector_impl_data._M_start)->file_id + 1));
        __buf = extraout_RDX_00;
      }
      local_270._4_4_ = local_270._4_4_ & 0xffffff00;
      local_270.depth = 1;
      local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::bucket::read(&local_270,(int)local_240,__buf,(size_t)__nbytes);
      piVar2 = local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar8 = local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar8 != piVar2; piVar8 = piVar8 + 1) {
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(uint)piVar8->page_id);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(uint)piVar8->record_id);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t",1);
        plVar5 = (long *)std::ostream::operator<<((ostream *)poVar4,piVar8->value);
        std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
        std::ostream::put((char)plVar5);
        std::ostream::flush();
      }
      if (local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_270.indices.super__Vector_base<index,_std::allocator<index>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_270.indices.super__Vector_base<index,_std::allocator<index>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_270.indices.super__Vector_base<index,_std::allocator<index>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::fstream::~fstream(local_240);
      uVar3 = this->bucket_size;
LAB_0010df76:
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar3);
    if ((uint *)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void directory::split(bucket &bucket, int bucket_no) {
    int local_depth, dir_depth = depth, pair_index;

    bucket.increaseDepth();

    local_depth = bucket.getDepth();

    class bucket split_bucket;

    split_bucket.id = generateBucketId(typeName);
    split_bucket.depth = local_depth;

    pair_index = pairIndex(bucket_no, local_depth);

    if(local_depth > depth) {
        grow();
        bucket_ids[bucket_no + (1 << dir_depth) ] = split_bucket.id;
    } else {
        if(bucket_no + (1 << (dir_depth - 1)) >= bucket_size) {

            bucket_ids[bucket_no ] = split_bucket.id;
        } else {

            bucket_ids[bucket_no + (1 << (dir_depth - 1)) ] = split_bucket.id;
        }
    }


    vector<index> copy = vector<index>(bucket.indices.begin(), bucket.indices.end());

    bucket.clear();

    for(auto &i: copy) {
        int _bucket_no = hash(i.value);

        if(bucket_ids[_bucket_no ] == split_bucket.id) {
            split_bucket.insert(i);
        } else if(bucket_ids[_bucket_no ] == bucket.id){
            bucket.insert(i);
        } else {
            cout << "error";
        }
    }

    fstream splitBucketFile(generateBucketFileName(typeName, split_bucket.id), OUTBIN);

    split_bucket.write(splitBucketFile);
}